

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs(void)

{
  Rep *pRVar1;
  NeuralNetwork *nn;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  DictionaryFeatureType *this;
  ArrayFeatureType *pAVar5;
  ostream *poVar6;
  int i;
  int iVar7;
  long lVar8;
  void **ppvVar9;
  bool bVar10;
  Model spec;
  FeatureDescription feature;
  TensorAttributes tensorAttributesOut;
  string predictedFeatureName;
  string targetName;
  string probsName;
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_d8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_78;
  TensorAttributes tensorAttributesIn;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  tensorAttributesOut.name = "OutTensor";
  tensorAttributesOut.dimension = 1;
  tensorAttributesOut._12_4_ = 0;
  buildBasicNeuralNetworkModel
            (&spec,true,&tensorAttributesIn,&tensorAttributesOut,0x400,false,false);
  spec.specificationversion_ = 4;
  nn = CoreML::Specification::Model::mutable_neuralnetwork(&spec);
  addSoftmaxLayer(&spec,"softmax","OutTensor","softmax_out");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&predictedFeatureName,"predictedFeatures",(allocator<char> *)&feature);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&probsName,"probs",(allocator<char> *)&feature);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,&predictedFeatureName);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,&probsName);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  this = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar4);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  CoreML::Specification::ModelDescription::set_predictedfeaturename(pMVar2,&predictedFeatureName);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  CoreML::Specification::ModelDescription::set_predictedprobabilitiesname(pMVar2,&probsName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&targetName,"cce_target",(allocator<char> *)&feature);
  addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetwork>
            (&spec,nn,"cross_entropy_loss_layer","softmax_out",targetName._M_dataplus._M_p);
  addLearningRate<CoreML::Specification::NeuralNetwork>(nn,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (nn,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_78);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_78);
  local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._M_impl.super__Rb_tree_header._M_header;
  local_a8._M_impl._0_8_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (nn,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_a8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_a8);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl._0_8_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (nn,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_d8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_d8);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(pMVar2->traininginput_).super_RepeatedPtrFieldBase);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"madeUpInput");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  iVar7 = 3;
  while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,&targetName);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,&predictedFeatureName);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar4);
  CoreML::Model::validate((Result *)&feature,&spec);
  CoreML::Result::operator=(&res,(Result *)&feature);
  std::__cxx11::string::~string((string *)&feature._internal_metadata_);
  bVar10 = CoreML::Result::good(&res);
  if (bVar10) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x728);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar7 = 1;
  }
  else {
    pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar2->output_).super_RepeatedPtrFieldBase);
    pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
    pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&pMVar2->output_);
    CoreML::Specification::FeatureDescription::set_name(pFVar3,tensorAttributesOut.name);
    pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
    pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
    pAVar5->datatype_ = 0x10020;
    for (iVar7 = 0; iVar7 < tensorAttributesOut.dimension; iVar7 = iVar7 + 1) {
      CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
    }
    if (spec.description_ == (ModelDescription *)0x0) {
      spec.description_ =
           (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar1 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    iVar7 = ((spec.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    for (lVar8 = 0; (long)iVar7 * 8 != lVar8; lVar8 = lVar8 + 8) {
      CoreML::Specification::FeatureDescription::FeatureDescription
                (&feature,*(FeatureDescription **)((long)ppvVar9 + lVar8));
      pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
      pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                         (&pMVar2->traininginput_);
      CoreML::Specification::FeatureDescription::CopyFrom(pFVar3,&feature);
      CoreML::Specification::FeatureDescription::~FeatureDescription(&feature);
    }
    CoreML::Model::validate((Result *)&feature,&spec);
    CoreML::Result::operator=(&res,(Result *)&feature);
    std::__cxx11::string::~string((string *)&feature._internal_metadata_);
    bVar10 = CoreML::Result::good(&res);
    iVar7 = 0;
    if (!bVar10) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x73a);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"(res).good()");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar7 = 1;
    }
  }
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::~string((string *)&probsName);
  std::__cxx11::string::~string((string *)&predictedFeatureName);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return iVar7;
}

Assistant:

int testInvalid_TargetPredictedFeatureNameAndFakeModelInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", "softmax_out");

    // Model is not a classifier, but we'll describe these things in the spec anyway to check this edge-case
    std::string predictedFeatureName = "predictedFeatures";
    std::string probsName = "probs";
    auto *output = spec.mutable_description()->add_output();
    output->set_name(predictedFeatureName);
    output->mutable_type()->mutable_stringtype();

    auto *outputProbs = spec.mutable_description()->add_output();
    outputProbs->set_name(probsName);
    outputProbs->mutable_type()->mutable_dictionarytype();
    outputProbs->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    spec.mutable_description()->set_predictedfeaturename(predictedFeatureName);
    spec.mutable_description()->set_predictedprobabilitiesname(probsName);

    std::string targetName = "cce_target";
    addCategoricalCrossEntropyLoss(spec, neuralNet, "cross_entropy_loss_layer", "softmax_out", targetName.c_str());

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    // Clearing and then specifically adding only the target as a training input
    spec.mutable_description()->clear_traininginput();

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(targetName);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(predictedFeatureName);
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_BAD(res);


    // Remove predictedFeatureName from model's outputs and add model's inputs to training inputs
    spec.mutable_description()->clear_output();
    auto outTensor = spec.mutable_description()->add_output();
    outTensor->set_name(tensorAttributesOut.name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < tensorAttributesOut.dimension; i++) {
        outTensorShape->add_shape(1);
    }

    for (auto feature : spec.description().input()) {
        auto trainingInputModel = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInputModel->CopyFrom(feature);
    }
    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);
    return 0;
}